

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O3

float __thiscall
deqp::gles3::Functional::Vertex3DTextureCase::calculateLod
          (Vertex3DTextureCase *this,Mat3 *transf,Vec2 *dstSize,int textureNdx)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Texture3D *pTVar5;
  undefined1 auVar6 [16];
  int row;
  long lVar7;
  Vector<float,_3> *pVVar8;
  int col_2;
  Vector<float,_3> *pVVar9;
  int col;
  long lVar10;
  uint uVar11;
  float v;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vec3 trans10;
  Vec3 trans01;
  Vec3 trans00;
  float local_40 [4];
  float local_30 [4];
  float local_20 [4];
  float local_10 [4];
  
  pTVar5 = this->m_textures[textureNdx];
  iVar2 = (pTVar5->m_refTexture).m_width;
  iVar3 = (pTVar5->m_refTexture).m_height;
  iVar4 = (pTVar5->m_refTexture).m_depth;
  lVar7 = 0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  local_30[2] = 1.0;
  local_20[0] = 0.0;
  local_20[1] = 0.0;
  local_20[2] = 0.0;
  pVVar8 = (Vector<float,_3> *)transf;
  do {
    fVar12 = 0.0;
    lVar10 = 0;
    pVVar9 = pVVar8;
    do {
      fVar12 = fVar12 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] *
                        local_30[lVar10];
      lVar10 = lVar10 + 1;
      pVVar9 = pVVar9 + 1;
    } while (lVar10 != 3);
    local_20[lVar7] = fVar12;
    lVar7 = lVar7 + 1;
    pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
  } while (lVar7 != 3);
  local_40[0] = 0.0;
  local_40[1] = 1.0;
  local_40[2] = 1.0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  local_30[2] = 0.0;
  lVar7 = 0;
  pVVar8 = (Vector<float,_3> *)transf;
  do {
    fVar12 = 0.0;
    lVar10 = 0;
    pVVar9 = pVVar8;
    do {
      fVar12 = fVar12 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] *
                        local_40[lVar10];
      lVar10 = lVar10 + 1;
      pVVar9 = pVVar9 + 1;
    } while (lVar10 != 3);
    local_30[lVar7] = fVar12;
    lVar7 = lVar7 + 1;
    pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
  } while (lVar7 != 3);
  local_10[0] = 1.0;
  local_10[1] = 0.0;
  local_10[2] = 1.0;
  local_40[0] = 0.0;
  local_40[1] = 0.0;
  local_40[2] = 0.0;
  lVar7 = 0;
  do {
    fVar12 = 0.0;
    lVar10 = 0;
    pVVar8 = (Vector<float,_3> *)transf;
    do {
      fVar12 = fVar12 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar8->m_data)->m_data[0].m_data[0] *
                        local_10[lVar10];
      lVar10 = lVar10 + 1;
      pVVar8 = pVVar8 + 1;
    } while (lVar10 != 3);
    local_40[lVar7] = fVar12;
    lVar7 = lVar7 + 1;
    transf = (Mat3 *)(((Vector<float,_3> *)transf)->m_data + 1);
  } while (lVar7 != 3);
  fVar15 = (float)iVar2;
  fVar17 = (float)iVar3;
  fVar12 = (float)iVar4;
  auVar16._0_4_ = fVar15 * (local_40[0] - local_20[0]);
  auVar16._4_4_ = fVar15 * (local_30[0] - local_20[0]);
  auVar16._8_4_ = fVar15 * (0.0 - local_20[0]);
  auVar16._12_4_ = fVar15 * (0.0 - local_20[0]);
  uVar1 = *(ulong *)dstSize->m_data;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar16 = divps(auVar16,auVar14);
  auVar18._0_4_ = fVar17 * (local_40[1] - local_20[1]);
  auVar18._4_4_ = fVar17 * (local_30[1] - local_20[1]);
  auVar18._8_4_ = fVar17 * (0.0 - local_20[1]);
  auVar18._12_4_ = fVar17 * (0.0 - local_20[1]);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19 = divps(auVar18,auVar19);
  auVar13._0_4_ = fVar12 * (local_40[2] - local_20[2]);
  auVar13._4_4_ = fVar12 * (local_30[2] - local_20[2]);
  auVar13._8_4_ = fVar12 * (0.0 - local_20[2]);
  auVar13._12_4_ = fVar12 * (0.0 - local_20[2]);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar14 = divps(auVar13,auVar6);
  fVar12 = auVar14._0_4_ * auVar14._0_4_ +
           auVar16._0_4_ * auVar16._0_4_ + auVar19._0_4_ * auVar19._0_4_;
  fVar15 = auVar14._4_4_ * auVar14._4_4_ +
           auVar16._4_4_ * auVar16._4_4_ + auVar19._4_4_ * auVar19._4_4_;
  uVar11 = -(uint)(fVar15 <= fVar12);
  fVar12 = logf(SQRT((float)(~uVar11 & (uint)fVar15 | (uint)fVar12 & uVar11)));
  return fVar12 * 1.442695;
}

Assistant:

float Vertex3DTextureCase::calculateLod (const Mat3& transf, const Vec2& dstSize, int textureNdx) const
{
	const tcu::Texture3D&	refTexture	= m_textures[textureNdx]->getRefTexture();
	const int				srcWidth	= refTexture.getWidth();
	const int				srcHeight	= refTexture.getHeight();
	const int				srcDepth	= refTexture.getDepth();

	// Calculate transformed coordinates of three screen corners.
	const Vec3				trans00		= transf * Vec3(0.0f, 0.0f, 1.0f);
	const Vec3				trans01		= transf * Vec3(0.0f, 1.0f, 1.0f);
	const Vec3				trans10		= transf * Vec3(1.0f, 0.0f, 1.0f);

	// Derivates.
	const float dudx = (trans10.x() - trans00.x()) * (float)srcWidth / dstSize.x();
	const float dudy = (trans01.x() - trans00.x()) * (float)srcWidth / dstSize.y();
	const float dvdx = (trans10.y() - trans00.y()) * (float)srcHeight / dstSize.x();
	const float dvdy = (trans01.y() - trans00.y()) * (float)srcHeight / dstSize.y();
	const float dwdx = (trans10.z() - trans00.z()) * (float)srcDepth / dstSize.x();
	const float dwdy = (trans01.z() - trans00.z()) * (float)srcDepth / dstSize.y();

	return deFloatLog2(deFloatSqrt(de::max(dudx*dudx + dvdx*dvdx + dwdx*dwdx, dudy*dudy + dvdy*dvdy + dwdy*dwdy)));
}